

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O2

BYTE * __thiscall
Js::SharedArrayBuffer::AllocBuffer(SharedArrayBuffer *this,uint32 length,uint32 maxLength)

{
  HeapAllocator *this_00;
  BYTE *pBVar1;
  undefined1 local_38 [8];
  TrackAllocData data;
  
  local_38 = (undefined1  [8])&unsigned_char::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_8c1ccee;
  data.filename._0_4_ = 0xf0;
  data.plusSize = (ulong)length;
  this_00 = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_38);
  pBVar1 = (BYTE *)Memory::HeapAllocator::AllocT<true>(this_00,(ulong)length);
  return pBVar1;
}

Assistant:

BYTE* SharedArrayBuffer::AllocBuffer(uint32 length, uint32 maxLength)
    {
        Unused(maxLength); // WebAssembly only
#if ENABLE_FAST_ARRAYBUFFER
        if (this->IsValidVirtualBufferLength(length))
        {
            return (BYTE*)AsmJsVirtualAllocator(length);
        }
        else
#endif
        {
            return HeapNewNoThrowArray(BYTE, length);
        }
    }